

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O2

Vec_Bit_t * Acec_MultMarkPPs(Gia_Man_t *p)

{
  int iVar1;
  Vec_Bit_t *p_00;
  Vec_Wrd_t *p_01;
  Vec_Int_t *p_02;
  Gia_Obj_t *pGVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  int v;
  word Truth;
  
  p_00 = Vec_BitStart(p->nObjs);
  p_01 = Vec_WrdStart(p->nObjs);
  p_02 = Vec_IntAlloc(100);
  Gia_ManCleanMark0(p);
  v = 0;
  uVar5 = 0;
  do {
    if (p->nObjs <= v) {
      Gia_ManCleanMark0(p);
      printf("Collected %d pps.\n",(ulong)uVar5);
      Vec_IntFree(p_02);
      Vec_WrdFree(p_01);
      return p_00;
    }
    iVar1 = v;
    pGVar2 = Gia_ManObj(p,v);
    if ((~*(uint *)pGVar2 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar2) {
      iVar1 = Abc_Var2Lit(v,iVar1);
      Truth = Gia_ObjComputeTruth6Cis(p,iVar1,p_02,p_01);
      if (p_02->nSize < 7) {
        iVar1 = Abc_Tt6MinBase(&Truth,p_02->pArray,p_02->nSize);
        p_02->nSize = iVar1;
        if (iVar1 < 6) {
          lVar3 = 0;
          do {
            if (lVar3 == 0x98) goto LAB_0053cb37;
            uVar4 = *(ulong *)((long)&DAT_008329b0 + lVar3);
            if (Truth == uVar4) break;
            uVar4 = uVar4 ^ Truth;
            lVar3 = lVar3 + 8;
          } while (uVar4 != 0xffffffffffffffff);
          Vec_BitWriteEntry(p_00,v,(int)uVar4);
          uVar5 = uVar5 + 1;
        }
      }
    }
LAB_0053cb37:
    v = v + 1;
  } while( true );
}

Assistant:

Vec_Bit_t * Acec_MultMarkPPs( Gia_Man_t * p )
{
    word Saved[32] = {
        ABC_CONST(0xF335ACC0F335ACC0),
        ABC_CONST(0x35C035C035C035C0),
        ABC_CONST(0xD728D728D728D728),
        ABC_CONST(0xFD80FD80FD80FD80),
        ABC_CONST(0xACC0ACC0ACC0ACC0),
        ABC_CONST(0x7878787878787878),
        ABC_CONST(0x2828282828282828),
        ABC_CONST(0xD0D0D0D0D0D0D0D0),
        ABC_CONST(0x8080808080808080),
        ABC_CONST(0x8888888888888888),
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0x5555555555555555),

        ABC_CONST(0xD5A8D5A8D5A8D5A8),
        ABC_CONST(0x2A572A572A572A57),
        ABC_CONST(0xF3C0F3C0F3C0F3C0),
        ABC_CONST(0x5858585858585858),
        ABC_CONST(0xA7A7A7A7A7A7A7A7),
        ABC_CONST(0x2727272727272727),
        ABC_CONST(0xD8D8D8D8D8D8D8D8)
    };

    Vec_Bit_t * vRes = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Wrd_t * vTemp = Vec_WrdStart( Gia_ManObjNum(p) );
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    int i, iObj, nProds = 0;
    Gia_ManCleanMark0(p);
    Gia_ManForEachAndId( p, iObj )
    {
        word Truth = Gia_ObjComputeTruth6Cis( p, Abc_Var2Lit(iObj, 0), vSupp, vTemp );
        if ( Vec_IntSize(vSupp) > 6  )
            continue;
        vSupp->nSize = Abc_Tt6MinBase( &Truth, vSupp->pArray, vSupp->nSize );
        if ( Vec_IntSize(vSupp) > 5  )
            continue;
        for ( i = 0; i < 32 && Saved[i]; i++ )
        {
            if ( Truth == Saved[i] || Truth == ~Saved[i] )
            {
                Vec_BitWriteEntry( vRes, iObj, 1 );
                nProds++;
                break;
            }
        }
    }
    Gia_ManCleanMark0(p);
    printf( "Collected %d pps.\n", nProds );
    Vec_IntFree( vSupp );
    Vec_WrdFree( vTemp );
    return vRes;
}